

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O2

bool __thiscall Json::Reader::decodeNumber(Reader *this,Token *token,Value *decoded)

{
  char cVar1;
  byte bVar2;
  char *pcVar3;
  byte *pbVar4;
  bool bVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  Value *other;
  ulong uVar9;
  uint uVar10;
  byte *pbVar11;
  ulong uVar12;
  bool bVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Value local_98;
  Value local_70;
  Value local_48;
  
  pcVar3 = token->start_;
  pbVar4 = (byte *)token->end_;
  bVar13 = false;
  for (lVar6 = 0; (byte *)(pcVar3 + lVar6) != pbVar4; lVar6 = lVar6 + 1) {
    bVar5 = !bVar13;
    bVar13 = true;
    if (bVar5) {
      uVar10 = (byte)pcVar3[lVar6] - 0x2b;
      if (uVar10 < 0x3b) {
        if ((0x400000004000009U >> ((ulong)uVar10 & 0x3f) & 1) == 0) {
          if ((ulong)uVar10 != 2) goto LAB_00110638;
          bVar13 = lVar6 != 0;
        }
      }
      else {
LAB_00110638:
        bVar13 = false;
      }
    }
  }
  if (bVar13) {
LAB_00110642:
    bVar13 = decodeDouble(this,token,decoded);
    return bVar13;
  }
  cVar1 = *pcVar3;
  uVar7 = -(ulong)(cVar1 != '-') | 0x8000000000000000;
  uVar8 = uVar7 / 10;
  pbVar11 = (byte *)(pcVar3 + (cVar1 == '-'));
  uVar9 = 0;
  while (pbVar11 < pbVar4) {
    bVar2 = *pbVar11;
    if ((byte)(bVar2 - 0x3a) < 0xf6) {
      local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,pcVar3,pbVar4);
      std::operator+(&local_d8,"\'",&local_f8);
      std::operator+(&local_b8,&local_d8,"\' is not a number.");
      addError(this,&local_b8,token,(Location)0x0);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_f8);
      return false;
    }
    pbVar11 = pbVar11 + 1;
    uVar12 = (ulong)(bVar2 - 0x30);
    if ((uVar8 <= uVar9) && (((uVar8 < uVar9 || (pbVar11 != pbVar4)) || (uVar7 % 10 < uVar12))))
    goto LAB_00110642;
    uVar9 = uVar9 * 10 + uVar12;
  }
  if (cVar1 == '-') {
    uVar9 = -uVar9;
    other = &local_48;
  }
  else {
    if (0x7fffffff < uVar9) {
      other = &local_98;
      local_98._8_2_ = 2;
      goto LAB_0011076d;
    }
    other = &local_70;
  }
  *(undefined2 *)&other->field_0x8 = 1;
LAB_0011076d:
  other->comments_ = (CommentInfo *)0x0;
  other->start_ = 0;
  other->limit_ = 0;
  (other->value_).int_ = uVar9;
  Value::swap(decoded,other);
  Value::~Value(other);
  return true;
}

Assistant:

bool Reader::decodeNumber(Token& token, Value& decoded) {
  bool isDouble = false;
  for (Location inspect = token.start_; inspect != token.end_; ++inspect) {
    isDouble = isDouble || in(*inspect, '.', 'e', 'E', '+') ||
               (*inspect == '-' && inspect != token.start_);
  }
  if (isDouble)
    return decodeDouble(token, decoded);
  // Attempts to parse the number as an integer. If the number is
  // larger than the maximum supported value of an integer then
  // we decode the number as a double.
  Location current = token.start_;
  bool isNegative = *current == '-';
  if (isNegative)
    ++current;
  Value::LargestUInt maxIntegerValue =
      isNegative ? Value::LargestUInt(-Value::minLargestInt)
                 : Value::maxLargestUInt;
  Value::LargestUInt threshold = maxIntegerValue / 10;
  Value::LargestUInt value = 0;
  while (current < token.end_) {
    Char c = *current++;
    if (c < '0' || c > '9')
      return addError("'" + std::string(token.start_, token.end_) +
                          "' is not a number.",
                      token);
    Value::UInt digit(c - '0');
    if (value >= threshold) {
      // We've hit or exceeded the max value divided by 10 (rounded down). If
      // a) we've only just touched the limit, b) this is the last digit, and
      // c) it's small enough to fit in that rounding delta, we're okay.
      // Otherwise treat this number as a double to avoid overflow.
      if (value > threshold || current != token.end_ ||
          digit > maxIntegerValue % 10) {
        return decodeDouble(token, decoded);
      }
    }
    value = value * 10 + digit;
  }
  if (isNegative)
    decoded = -Value::LargestInt(value);
  else if (value <= Value::LargestUInt(Value::maxInt))
    decoded = Value::LargestInt(value);
  else
    decoded = value;
  return true;
}